

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O1

FT_Error sdf_move_to(FT_26D6_Vec *to,void *user)

{
  FT_Pos FVar1;
  FT_Error FVar2;
  SDF_Contour *contour;
  SDF_Contour *local_18;
  
  local_18 = (SDF_Contour *)0x0;
  if (to == (FT_26D6_Vec *)0x0) {
    FVar2 = 6;
  }
  else {
    FVar2 = sdf_contour_new(*user,&local_18);
    if (FVar2 == 0) {
      FVar1 = to->y;
      (local_18->last_pos).x = to->x;
      (local_18->last_pos).y = FVar1;
      local_18->next = *(SDF_Contour_ **)((long)user + 8);
      *(SDF_Contour **)((long)user + 8) = local_18;
      FVar2 = 0;
    }
  }
  return FVar2;
}

Assistant:

static FT_Error
  sdf_move_to( const FT_26D6_Vec* to,
               void*              user )
  {
    SDF_Shape*    shape   = ( SDF_Shape* )user;
    SDF_Contour*  contour = NULL;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = shape->memory;


    if ( !to || !user )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_CALL( sdf_contour_new( memory, &contour ) );

    contour->last_pos = *to;
    contour->next     = shape->contours;
    shape->contours   = contour;

  Exit:
    return error;
  }